

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

void helicsFederateRegisterInterfaces(HelicsFederate fed,char *file,HelicsError *err)

{
  element_type *peVar1;
  FedObject *pFVar2;
  size_t sVar3;
  long *local_40 [2];
  long local_30 [2];
  
  pFVar2 = helics::getFedObject(fed,err);
  if ((pFVar2 != (FedObject *)0x0) &&
     (peVar1 = (pFVar2->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 != (element_type *)0x0)) {
    if (file == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "Invalid File specification";
      }
    }
    else {
      local_40[0] = local_30;
      sVar3 = strlen(file);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,file,file + sVar3);
      (*peVar1->_vptr_Federate[0xf])(peVar1,local_40);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void helicsFederateRegisterInterfaces(HelicsFederate fed, const char* file, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    if (file == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidFile);
        return;
    }
    try {
        fedObj->registerInterfaces(file);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}